

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_gf100_2d.c
# Opt level: O3

void decode_gf100_2d_init(gpu_object *obj)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = calloc(1,0x68);
  obj->class_data = pvVar1;
  obj->class_data_destroy = destroy_gf100_2d_data;
  puVar2 = (undefined8 *)calloc(5,0x20);
  *(undefined8 **)((long)pvVar1 + 0x60) = puVar2;
  *puVar2 = 0x1400000010;
  puVar2[1] = pvVar1;
  puVar2[4] = 0x10800000104;
  puVar2[5] = (long)pvVar1 + 0x18;
  puVar2[8] = 0x25400000250;
  puVar2[9] = (long)pvVar1 + 0x30;
  puVar2[0xc] = 0x22400000220;
  puVar2[0xd] = (long)pvVar1 + 0x48;
  return;
}

Assistant:

void decode_gf100_2d_init(struct gpu_object *obj)
{
	struct gf100_2d_data *d = obj->class_data = calloc(1, sizeof(struct gf100_2d_data));
	obj->class_data_destroy = destroy_gf100_2d_data;

#define SZ 5
	struct mthd2addr *tmp = d->addresses = calloc(SZ, sizeof(*d->addresses));
	m2a_set1(tmp++, 0x0010, 0x0014, &d->subchan.semaphore);
	m2a_set1(tmp++, 0x0104, 0x0108, &d->graph.notify);
	m2a_set1(tmp++, 0x0250, 0x0254, &d->src);
	m2a_set1(tmp++, 0x0220, 0x0224, &d->dst);
	m2a_set1(tmp++, 0, 0, NULL);
	assert(tmp - d->addresses == SZ);
#undef SZ
}